

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixSetSystemCall(sqlite3_vfs *pNotUsed,char *zName,sqlite3_syscall_ptr pNewFunc)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (zName == (char *)0x0) {
    lVar3 = 0x10;
    do {
      lVar1 = *(long *)((long)&aSyscall[0].zName + lVar3);
      if (lVar1 != 0) {
        *(long *)(lVar3 + 0x2b00c8) = lVar1;
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x2b0);
    return 0;
  }
  lVar3 = 0x10;
  do {
    iVar2 = strcmp(zName,*(char **)((long)&sqlite3PendingByte + lVar3));
    if (iVar2 == 0) {
      if (*(long *)((long)&aSyscall[0].zName + lVar3) == 0) {
        *(undefined8 *)((long)&aSyscall[0].zName + lVar3) = *(undefined8 *)(lVar3 + 0x2b00c8);
      }
      if (pNewFunc == (sqlite3_syscall_ptr)0x0) {
        pNewFunc = *(sqlite3_syscall_ptr *)((long)&aSyscall[0].zName + lVar3);
      }
      *(sqlite3_syscall_ptr *)(lVar3 + 0x2b00c8) = pNewFunc;
      return 0;
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x2b0);
  return 0xc;
}

Assistant:

static int unixSetSystemCall(
  sqlite3_vfs *pNotUsed,        /* The VFS pointer.  Not used */
  const char *zName,            /* Name of system call to override */
  sqlite3_syscall_ptr pNewFunc  /* Pointer to new system call value */
){
  unsigned int i;
  int rc = SQLITE_NOTFOUND;

  UNUSED_PARAMETER(pNotUsed);
  if( zName==0 ){
    /* If no zName is given, restore all system calls to their default
    ** settings and return NULL
    */
    rc = SQLITE_OK;
    for(i=0; i<sizeof(aSyscall)/sizeof(aSyscall[0]); i++){
      if( aSyscall[i].pDefault ){
        aSyscall[i].pCurrent = aSyscall[i].pDefault;
      }
    }
  }else{
    /* If zName is specified, operate on only the one system call
    ** specified.
    */
    for(i=0; i<sizeof(aSyscall)/sizeof(aSyscall[0]); i++){
      if( strcmp(zName, aSyscall[i].zName)==0 ){
        if( aSyscall[i].pDefault==0 ){
          aSyscall[i].pDefault = aSyscall[i].pCurrent;
        }
        rc = SQLITE_OK;
        if( pNewFunc==0 ) pNewFunc = aSyscall[i].pDefault;
        aSyscall[i].pCurrent = pNewFunc;
        break;
      }
    }
  }
  return rc;
}